

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall deqp::egl::GLES2ThreadTest::DetachShader::exec(DetachShader *this,Thread *t)

{
  Program *pPVar1;
  deUint32 dVar2;
  Thread *pTVar3;
  MessageBuilder *pMVar4;
  undefined1 local_1b0 [400];
  
  pTVar3 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar3 != (Thread *)0x0) {
    local_1b0._0_8_ = pTVar3;
    if (this->m_type == 0x8b30) {
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 0x18),"Begin -- glDetachShader(");
      pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,&((this->m_program).m_ptr)->program);
      std::operator<<((ostream *)&pMVar4->field_0x18,", ");
      pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                         (pMVar4,&((this->m_program).m_ptr)->runtimeFragmentShader);
      std::operator<<((ostream *)&pMVar4->field_0x18,")");
      tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End)
      ;
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
      pPVar1 = (this->m_program).m_ptr;
      (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0x4e0))
                (pPVar1->program,pPVar1->runtimeFragmentShader);
      dVar2 = (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0x800))();
      glu::checkError(dVar2,"detachShader(m_program->program, m_program->runtimeFragmentShader)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                      ,0x65b);
      local_1b0._0_8_ = pTVar3;
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 0x18),"End -- glDetachShader()");
      tcu::ThreadUtil::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
      ((this->m_program).m_ptr)->runtimeFragmentShader = 0;
    }
    else if (this->m_type == 0x8b31) {
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 0x18),"Begin -- glDetachShader(");
      pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,&((this->m_program).m_ptr)->program);
      std::operator<<((ostream *)&pMVar4->field_0x18,", ");
      pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                         (pMVar4,&((this->m_program).m_ptr)->runtimeVertexShader);
      std::operator<<((ostream *)&pMVar4->field_0x18,")");
      tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End)
      ;
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
      pPVar1 = (this->m_program).m_ptr;
      (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0x4e0))
                (pPVar1->program,pPVar1->runtimeVertexShader);
      dVar2 = (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0x800))();
      glu::checkError(dVar2,"detachShader(m_program->program, m_program->runtimeVertexShader)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                      ,0x654);
      local_1b0._0_8_ = pTVar3;
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 0x18),"End -- glDetachShader()");
      tcu::ThreadUtil::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
      ((this->m_program).m_ptr)->runtimeVertexShader = 0;
    }
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void DetachShader::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	if (m_type == GL_VERTEX_SHADER)
	{
		thread.newMessage() << "Begin -- glDetachShader(" << m_program->program << ", " << m_program->runtimeVertexShader << ")" << tcu::ThreadUtil::Message::End;
		GLU_CHECK_GLW_CALL(thread.gl, detachShader(m_program->program, m_program->runtimeVertexShader));
		thread.newMessage() << "End -- glDetachShader()" << tcu::ThreadUtil::Message::End;
		m_program->runtimeVertexShader = 0;
	}
	else if (m_type == GL_FRAGMENT_SHADER)
	{
		thread.newMessage() << "Begin -- glDetachShader(" << m_program->program << ", " << m_program->runtimeFragmentShader << ")" << tcu::ThreadUtil::Message::End;
		GLU_CHECK_GLW_CALL(thread.gl, detachShader(m_program->program, m_program->runtimeFragmentShader));
		thread.newMessage() << "End -- glDetachShader()" << tcu::ThreadUtil::Message::End;
		m_program->runtimeFragmentShader = 0;
	}
	else
		DE_ASSERT(false);
}